

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O3

void capnp::_::
     checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<bool> expected)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  Fault f;
  ulong local_68;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  ListElementCount local_34;
  
  uVar3 = expected._M_len;
  _kjCondition.right = reader.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = reader.builder.elementCount == uVar3;
  if (_kjCondition.result) {
    if (uVar3 != 0) {
      uVar4 = 1;
      uVar2 = 0;
      iVar1 = kj::_::Debug::minSeverity;
      do {
        f.exception._0_1_ = expected._M_array[uVar2];
        bVar5 = (reader.builder.ptr[uVar4 - 1 >> 3] >> (uVar4 - 1 & 7) & 1) != 0;
        local_68 = CONCAT71(local_68._1_7_,bVar5);
        _kjCondition.result = (bool)(bVar5 ^ (byte)f.exception ^ 1);
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        if ((_kjCondition.result == false) && (iVar1 < 3)) {
          _kjCondition.left = (unsigned_long)&f;
          _kjCondition._8_8_ = &local_68;
          kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<bool&,bool&>&,bool&,bool&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", _kjCondition, a, b",
                     (char (*) [28])"failed: expected (a) == (b)",
                     (DebugComparison<bool_&,_bool_&> *)&_kjCondition,(bool *)&f,(bool *)&local_68);
          iVar1 = kj::_::Debug::minSeverity;
        }
        uVar2 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar2 < uVar3);
    }
    return;
  }
  local_34 = reader.builder.elementCount;
  local_68 = uVar3;
  _kjCondition.left = uVar3;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())",
             "_kjCondition,expected.size(), reader.size()",&_kjCondition,&local_68,&local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}